

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void RecalcAttributeStorageSize(SstStream Stream)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  void *pvVar4;
  long in_RDI;
  size_t NewAttributeSize;
  FMFieldList LastAttributeField;
  FFSWriterMarshalBase *Info;
  
  lVar1 = *(long *)(in_RDI + 0x1c0);
  if (*(int *)(lVar1 + 0x48) != 0) {
    lVar3 = *(long *)(lVar1 + 0x50) + (long)(*(int *)(lVar1 + 0x48) + -1) * 0x18;
    uVar2 = *(int *)(lVar3 + 0x14) + *(int *)(lVar3 + 0x10) + 7U & 0xfffffff8;
    pvVar4 = realloc(*(void **)(lVar1 + 0x60),(long)(int)uVar2 + 8);
    *(void **)(lVar1 + 0x60) = pvVar4;
    memset((void *)(*(long *)(lVar1 + 0x60) + (long)*(int *)(lVar1 + 0x68)),0,
           (long)(int)uVar2 - (long)*(int *)(lVar1 + 0x68));
    *(uint *)(lVar1 + 0x68) = uVar2;
  }
  return;
}

Assistant:

static void RecalcAttributeStorageSize(SstStream Stream)
{
    struct FFSWriterMarshalBase *Info = Stream->WriterMarshalData;
    if (Info->AttributeFieldCount)
    {
        FMFieldList LastAttributeField;
        size_t NewAttributeSize;
        LastAttributeField = &Info->AttributeFields[Info->AttributeFieldCount - 1];
        NewAttributeSize =
            (LastAttributeField->field_offset + LastAttributeField->field_size + 7) & ~7;
        Info->AttributeData = realloc(Info->AttributeData, NewAttributeSize + 8);
        memset((char *)(Info->AttributeData) + Info->AttributeSize, 0,
               NewAttributeSize - Info->AttributeSize);
        Info->AttributeSize = (int)NewAttributeSize;
    }
}